

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringCache.h
# Opt level: O2

JavascriptString * __thiscall
Js::StringCache::InitializeString<false,10ul>(StringCache *this,char16 (*value) [10])

{
  JavascriptString *pJVar1;
  
  pJVar1 = &LiteralString::New((this->stringTypeStatic).ptr,*value,9,
                               ((this->scriptContext).ptr)->recycler)->super_JavascriptString;
  return pJVar1;
}

Assistant:

JavascriptString* InitializeString(const char16(&value)[N]) const
    {
        if (withPropertyString)
        {
            const PropertyRecord* propertyRecord = nullptr;
            scriptContext->FindPropertyRecord(value, N - 1, &propertyRecord);
            AssertMsg(propertyRecord != nullptr, "Trying to create a propertystring for non property string?");
            Assert(IsBuiltInPropertyId(propertyRecord->GetPropertyId()));
            return scriptContext->GetPropertyString(propertyRecord->GetPropertyId());
        }
        else
        {
            return LiteralString::New(stringTypeStatic, value, N - 1 /*don't include terminating NUL*/, scriptContext->GetRecycler());
        }
    }